

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int anon_unknown.dwarf_3ea2e::HandleCppLint
              (string *runCmd,string *sourceFile,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *param_3)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  int ret;
  string stdOut;
  cmList cpplint_cmd;
  
  iVar3 = 1;
  cmList::cmList(&cpplint_cmd,runCmd,Yes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&cpplint_cmd.Values,sourceFile);
  stdOut._M_dataplus._M_p = (pointer)&stdOut.field_2;
  stdOut._M_string_length = 0;
  stdOut.field_2._M_local_buf[0] = '\0';
  bVar1 = cmSystemTools::RunSingleCommand
                    (&cpplint_cmd.Values,&stdOut,&stdOut,&ret,(char *)0x0,OUTPUT_NONE,
                     (cmDuration)0x0,Auto);
  if (bVar1) {
    iVar3 = 0;
    if (stdOut._M_string_length != 0) {
      std::operator<<((ostream *)&std::cerr,"Warning: cpplint diagnostics:\n");
      std::operator<<((ostream *)&std::cerr,(string *)&stdOut);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error running \'");
    poVar2 = std::operator<<(poVar2,(string *)
                                    cpplint_cmd.Values.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar2 = std::operator<<(poVar2,"\': ");
    poVar2 = std::operator<<(poVar2,(string *)&stdOut);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&stdOut);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cpplint_cmd.Values);
  return iVar3;
}

Assistant:

int HandleCppLint(const std::string& runCmd, const std::string& sourceFile,
                  const std::vector<std::string>&)
{
  // Construct the cpplint command line.
  cmList cpplint_cmd{ runCmd, cmList::EmptyElements::Yes };
  cpplint_cmd.push_back(sourceFile);

  // Run the cpplint command line.  Capture its output.
  std::string stdOut;
  int ret;
  if (!cmSystemTools::RunSingleCommand(cpplint_cmd, &stdOut, &stdOut, &ret,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    std::cerr << "Error running '" << cpplint_cmd[0] << "': " << stdOut
              << "\n";
    return 1;
  }
  if (!stdOut.empty()) {
    std::cerr << "Warning: cpplint diagnostics:\n";
    // Output the output from cpplint to stderr
    std::cerr << stdOut;
  }

  // always return 0 so the build can continue as cpplint returns non-zero
  // for any warning
  return 0;
}